

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QIconLoaderEngineEntry * QIconLoaderEngine::entryForSize(QThemeIconInfo *info,QSize *size,int scale)

{
  int iconsize_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  QIconDirInfo *dir;
  pointer pQVar5;
  int in_EDX;
  vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  int deltaValue;
  unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *entry;
  QThemeIconEntries *__range1;
  QIconLoaderEngineEntry *closestMatch;
  int iconsize;
  const_iterator __end1;
  const_iterator __begin1;
  int minimalDelta;
  optional<int> delta;
  __normal_iterator<const_std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
  *in_stack_ffffffffffffff78;
  vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  *in_stack_ffffffffffffff80;
  vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int iVar6;
  int in_stack_ffffffffffffff94;
  pointer local_58;
  pointer local_38;
  __normal_iterator<const_std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
  local_28;
  int local_1c;
  int local_18;
  int local_14;
  _Optional_payload_base<int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::empty(in_stack_ffffffffffffff88);
  if (bVar1) {
    local_38 = (pointer)0x0;
  }
  else {
    sVar3 = std::
            vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ::size(in_RDI);
    if (sVar3 == 1) {
      std::
      vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ::at(in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      local_38 = std::
                 unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
                 get((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                      *)0x2a300e);
    }
    else {
      local_14 = QSize::width((QSize *)0x2a3022);
      local_18 = QSize::height((QSize *)0x2a3030);
      piVar4 = qMin<int>(&local_14,&local_18);
      iconsize_00 = *piVar4;
      local_1c = -0x80000000;
      local_58 = (pointer)0x0;
      local_28._M_current =
           (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *)
           &DAT_aaaaaaaaaaaaaaaa;
      local_28._M_current =
           (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *)
           std::
           vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ::begin(in_stack_ffffffffffffff80);
      std::
      vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ::end(in_stack_ffffffffffffff80);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
                                 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), bVar1) {
        dir = (QIconDirInfo *)
              __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
              ::operator*(&local_28);
        pQVar5 = std::
                 unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
                 operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                             *)0x2a30e9);
        bVar1 = directoryMatchesSizeAndScale(&pQVar5->dir,iconsize_00,in_EDX);
        if (bVar1) {
          local_38 = std::
                     unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                     ::get((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                            *)0x2a310d);
          goto LAB_002a323d;
        }
        local_10 = (_Optional_payload_base<int>)&DAT_aaaaaaaaaaaaaaaa;
        std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
        operator->((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                    *)0x2a312d);
        local_10 = (_Optional_payload_base<int>)
                   directorySizeDelta(dir,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
        bVar1 = std::optional<int>::has_value((optional<int> *)0x2a3150);
        if (bVar1) {
          piVar4 = std::optional<int>::value((optional<int> *)in_stack_ffffffffffffff80);
          iVar6 = *piVar4;
          if ((local_1c < iVar6) && (local_1c < 1)) {
            local_1c = iVar6;
            local_58 = std::
                       unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                       ::get((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                              *)0x2a318c);
            in_stack_ffffffffffffff94 = iVar6;
          }
          else {
            in_stack_ffffffffffffff94 = iVar6;
            if ((iVar6 < 1) ||
               (iVar2 = qAbs<int>(&local_1c), in_stack_ffffffffffffff90 = iVar6, iVar2 <= iVar6)) {
              if (in_stack_ffffffffffffff94 == 0) {
                local_1c = in_stack_ffffffffffffff94;
                local_58 = std::
                           unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                           ::get((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                                  *)0x2a31e8);
              }
            }
            else {
              local_1c = in_stack_ffffffffffffff94;
              local_58 = std::
                         unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                         ::get((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                                *)0x2a31c8);
              in_stack_ffffffffffffff90 = iVar6;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
        ::operator++(&local_28);
      }
      local_38 = local_58;
      if (local_58 == (pointer)0x0) {
        std::
        vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
        ::at(in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
        local_38 = std::
                   unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                   ::get((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                          *)0x2a322e);
      }
    }
  }
LAB_002a323d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

QIconLoaderEngineEntry *QIconLoaderEngine::entryForSize(const QThemeIconInfo &info, const QSize &size, int scale)
{
    if (info.entries.empty())
        return nullptr;
    if (info.entries.size() == 1)
        return info.entries.at(0).get();

    int iconsize = qMin(size.width(), size.height());

    // Note that m_info.entries are sorted so that png-files
    // come first

    int minimalDelta = INT_MIN;
    QIconLoaderEngineEntry *closestMatch = nullptr;
    for (const auto &entry : info.entries) {
        // exact match in scale and dpr
        if (directoryMatchesSizeAndScale(entry->dir, iconsize, scale))
            return entry.get();

        // Find the minimum distance icon
        const auto delta = directorySizeDelta(entry->dir, iconsize, scale);
        if (delta.has_value()) {
            const auto deltaValue = delta.value();
            // always prefer downscaled icons over upscaled icons
            if (deltaValue > minimalDelta && minimalDelta <= 0) {
                minimalDelta = deltaValue;
                closestMatch = entry.get();
            } else if (deltaValue > 0 && deltaValue < qAbs(minimalDelta)) {
                minimalDelta = deltaValue;
                closestMatch = entry.get();
            } else if (deltaValue == 0) {
                // exact match but different dpr:
                // --> size * scale == entry.size * entry.scale
                minimalDelta = deltaValue;
                closestMatch = entry.get();
            }
        }
    }
    return closestMatch ? closestMatch : info.entries.at(0).get();
}